

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  LZ4_byte *pLVar4;
  LZ4_stream_t_internal *__src;
  int iVar5;
  char cVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  ulong uVar14;
  ulong *puVar15;
  long lVar16;
  ulong *puVar17;
  ulong *puVar18;
  long *plVar19;
  uint uVar20;
  int iVar21;
  int *piVar22;
  ushort uVar23;
  int iVar24;
  uint uVar25;
  BYTE *e;
  long *plVar26;
  BYTE *e_3;
  int *piVar27;
  uint uVar28;
  ulong *puVar29;
  long lVar30;
  long lVar31;
  ulong *puVar32;
  char *__s;
  ulong *puVar33;
  long *plVar34;
  char *pcVar35;
  uint uVar36;
  int *piVar37;
  int *piVar38;
  BYTE *e_4;
  long lVar39;
  BYTE *s;
  long *plVar40;
  uint uVar41;
  BYTE *e_1;
  BYTE *s_2;
  long lVar42;
  ulong *puVar43;
  ulong *puVar44;
  ulong *puVar45;
  int iVar46;
  BYTE *e_2;
  U32 *hashTable_16;
  char *local_d8;
  int local_c8;
  U32 *hashTable;
  uint local_58;
  
  uVar41 = (LZ4_stream->internal_donotuse).dictSize;
  pLVar4 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  uVar11 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (pLVar4 + uVar41 == (LZ4_byte *)source ||
      (LZ4_stream->internal_donotuse).dictSize - 4 < 0xfffffffd) {
    piVar27 = (int *)(pLVar4 + uVar41);
    piVar37 = (int *)(LZ4_stream->internal_donotuse).dictionary;
  }
  else {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    uVar11 = 0;
    piVar27 = (int *)source;
    piVar37 = (int *)source;
  }
  piVar22 = (int *)(source + inputSize);
  if ((piVar37 < piVar22) && (piVar22 < piVar27)) {
    uVar28 = (int)piVar27 - (int)piVar22;
    uVar41 = 0x10000;
    if (uVar28 < 0x10000) {
      uVar41 = uVar28;
    }
    uVar11 = 0;
    if (3 < uVar28) {
      uVar11 = (ulong)uVar41;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar11;
    piVar37 = (int *)((long)piVar27 - uVar11);
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)piVar37;
  }
  uVar41 = (uint)uVar11;
  iVar3 = (int)dest;
  if (piVar27 == (int *)source) {
    plVar40 = (long *)source;
    if (uVar41 < 0x10000) {
      uVar28 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar28 <= uVar41) goto LAB_001073ef;
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize == 0) goto LAB_0010777b;
      pcVar12 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar41 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar28 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar42 = (long)source - (ulong)uVar28;
        plVar8 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar28;
        plVar19 = (long *)(source + 2);
        puVar43 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00108c2e:
        lVar39 = *(long *)((long)plVar40 + 1);
        plVar34 = (long *)((long)plVar40 + 1);
        uVar25 = acceleration;
        uVar20 = acceleration * 0x40;
        while( true ) {
          plVar26 = plVar19;
          uVar20 = uVar20 + 1;
          uVar14 = (ulong)(lVar39 * -0x30e4432345000000) >> 0x34;
          uVar36 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          iVar21 = (int)plVar34;
          iVar24 = (int)lVar42;
          lVar39 = *plVar26;
          *(int *)((long)LZ4_stream + uVar14 * 4) = iVar21 - iVar24;
          if (((uVar28 - uVar41 <= uVar36) && ((uint)(iVar21 - iVar24) <= uVar36 + 0xffff)) &&
             (*(int *)(lVar42 + (ulong)uVar36) == (int)*plVar34)) break;
          uVar14 = (ulong)uVar25;
          uVar25 = uVar20 >> 6;
          plVar19 = (long *)(uVar14 + (long)plVar26);
          plVar34 = plVar26;
          if (plVar8 < (long *)(uVar14 + (long)plVar26)) goto LAB_0010901a;
        }
        lVar7 = (ulong)uVar36 + lVar42;
        uVar20 = iVar21 - (int)plVar40;
        lVar39 = 0;
        uVar25 = uVar20 - 0xf;
        cVar6 = (char)plVar34 * '\x10' + (char)plVar40 * -0x10;
        do {
          cVar13 = cVar6;
          uVar36 = uVar25;
          lVar16 = lVar39;
          piVar27 = (int *)(lVar7 + lVar16);
          plVar19 = (long *)((long)plVar34 + lVar16);
          if ((piVar27 <= source + -uVar11) || (plVar19 <= plVar40)) break;
          lVar39 = lVar16 + -1;
          uVar25 = uVar36 - 1;
          cVar6 = cVar13 + -0x10;
        } while (*(char *)((long)plVar34 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
        iVar46 = (int)lVar16;
        uVar14 = (ulong)(uint)(iVar46 + (iVar21 - (int)plVar40));
        if (pcVar12 < dest + ((ulong)uVar20 + lVar16 & 0xffffffff) / 0xff + uVar14 + 9) {
          return 0;
        }
        plVar34 = (long *)(dest + 1);
        if ((uint)((ulong)uVar20 + lVar16) < 0xf) {
          *dest = cVar13;
        }
        else {
          uVar9 = (ulong)(uVar20 - 0xf) + lVar16;
          *dest = -0x10;
          if (0xfe < (int)uVar9) {
            uVar25 = 0x1fd;
            if (uVar36 < 0x1fd) {
              uVar25 = uVar36;
            }
            if (0x1fc < (int)uVar36) {
              uVar36 = 0x1fd;
            }
            memset(plVar34,0xff,(ulong)((((uVar20 + 0xef) - uVar25) + iVar46) / 0xff + 1));
            uVar25 = ((uVar20 + 0xef) - uVar36) + iVar46;
            plVar34 = (long *)(dest + (ulong)uVar25 / 0xff + 2);
            uVar9 = (ulong)((uVar20 - 0x10e) + iVar46 + (uVar25 % 0xff - uVar25));
          }
          *(char *)plVar34 = (char)uVar9;
          plVar34 = (long *)((long)plVar34 + 1);
        }
        plVar26 = (long *)(uVar14 + (long)plVar34);
        do {
          *plVar34 = *plVar40;
          plVar34 = plVar34 + 1;
          plVar40 = plVar40 + 1;
        } while (plVar34 < plVar26);
        do {
          *(short *)plVar26 = (short)plVar19 - (short)piVar27;
          puVar44 = (ulong *)((long)plVar19 + 4);
          puVar32 = (ulong *)(piVar27 + 1);
          puVar45 = puVar44;
          if (puVar44 < puVar43) {
            if (*puVar32 == *puVar44) {
              puVar32 = (ulong *)(piVar27 + 3);
              puVar45 = (ulong *)((long)plVar19 + 0xc);
              goto LAB_00108e35;
            }
            uVar14 = *puVar44 ^ *puVar32;
            lVar39 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar25 = (uint)lVar39 >> 3;
          }
          else {
LAB_00108e35:
            if (puVar45 < puVar43) {
              iVar21 = ((int)puVar45 - (int)plVar19) + -4;
LAB_00108e43:
              if (*puVar32 == *puVar45) goto code_r0x00108e4e;
              uVar9 = *puVar45 ^ *puVar32;
              uVar14 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar25 = ((uint)(uVar14 >> 3) & 0x1fffffff) + iVar21;
              goto LAB_00108ec1;
            }
LAB_00108e5e:
            if ((puVar45 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar32 == (int)*puVar45)) {
              puVar45 = (ulong *)((long)puVar45 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar45 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar32 == (short)*puVar45)) {
              puVar45 = (ulong *)((long)puVar45 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar45 < source + ((ulong)(uint)inputSize - 5)) {
              puVar45 = (ulong *)((long)puVar45 + (ulong)((char)*puVar32 == (char)*puVar45));
            }
            uVar25 = (int)puVar45 - (int)puVar44;
          }
LAB_00108ec1:
          if (pcVar12 < (char *)((long)plVar26 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          pcVar10 = (char *)((long)plVar26 + 2);
          if (uVar25 < 0xf) {
            *dest = *dest + (char)uVar25;
            dest = pcVar10;
          }
          else {
            *dest = *dest + '\x0f';
            uVar23 = (ushort)(uVar25 - 0xf);
            pcVar10[0] = -1;
            pcVar10[1] = -1;
            pcVar10[2] = -1;
            pcVar10[3] = -1;
            if (0x3fb < uVar25 - 0xf) {
              uVar23 = (ushort)((ulong)(uVar25 - 0x40b) % 0x3fc);
              uVar14 = (ulong)((uVar25 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)plVar26 + 6),0xff,uVar14 + 4);
              pcVar10 = (char *)((long)plVar26 + uVar14 + 6);
            }
            pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
            dest = pcVar10 + uVar23 / 0xff + 1;
          }
          lVar39 = (long)plVar19 + (ulong)uVar25;
          plVar40 = (long *)(lVar39 + 4);
          if (plVar8 <= plVar40) break;
          *(int *)((long)LZ4_stream +
                  ((ulong)(*(long *)(lVar39 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)lVar39 + 2) - iVar24;
          uVar14 = (ulong)(*plVar40 * -0x30e4432345000000) >> 0x34;
          uVar20 = (int)plVar40 - iVar24;
          uVar25 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar20;
          if (((uVar25 < uVar28 - uVar41) || (uVar25 + 0xffff < uVar20)) ||
             (piVar27 = (int *)((ulong)uVar25 + lVar42), *piVar27 != *(int *)plVar40))
          goto LAB_00108fec;
          plVar26 = (long *)(dest + 1);
          *dest = '\0';
          plVar19 = plVar40;
        } while( true );
      }
LAB_0010901a:
      pcVar10 = source + ((ulong)(uint)inputSize - (long)plVar40);
      if (pcVar12 < dest + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1)) {
        return 0;
      }
      if (pcVar10 < (char *)0xf) {
        *dest = (char)pcVar10 << 4;
        goto LAB_001098e5;
      }
      *dest = -0x10;
      pcVar12 = dest;
    }
    else {
LAB_001073ef:
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize == 0) {
LAB_0010777b:
        if (maxOutputSize < 1) {
          return 0;
        }
        *dest = '\0';
        return 1;
      }
      uVar28 = (LZ4_stream->internal_donotuse).currentOffset;
      pcVar12 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar41 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar28 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar42 = (long)source - (ulong)uVar28;
        plVar8 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar28;
        plVar19 = (long *)(source + 2);
        puVar43 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00107813:
        lVar39 = *(long *)((long)plVar40 + 1);
        plVar34 = (long *)((long)plVar40 + 1);
        uVar28 = acceleration;
        uVar41 = acceleration * 0x40;
        while( true ) {
          uVar41 = uVar41 + 1;
          uVar14 = (ulong)(lVar39 * -0x30e4432345000000) >> 0x34;
          uVar25 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          iVar21 = (int)plVar34;
          iVar24 = (int)lVar42;
          lVar39 = *plVar19;
          *(int *)((long)LZ4_stream + uVar14 * 4) = iVar21 - iVar24;
          if (((uint)(iVar21 - iVar24) <= uVar25 + 0xffff) &&
             (*(int *)(lVar42 + (ulong)uVar25) == (int)*plVar34)) break;
          plVar26 = (long *)((ulong)uVar28 + (long)plVar19);
          uVar28 = uVar41 >> 6;
          plVar34 = plVar19;
          plVar19 = plVar26;
          if (plVar8 < plVar26) goto LAB_00107bf7;
        }
        lVar7 = (ulong)uVar25 + lVar42;
        uVar28 = iVar21 - (int)plVar40;
        lVar39 = 0;
        uVar41 = uVar28 - 0xf;
        cVar6 = (char)plVar34 * '\x10' + (char)plVar40 * -0x10;
        do {
          cVar13 = cVar6;
          uVar25 = uVar41;
          lVar16 = lVar39;
          piVar27 = (int *)(lVar7 + lVar16);
          plVar19 = (long *)((long)plVar34 + lVar16);
          if ((piVar27 <= source + -uVar11) || (plVar19 <= plVar40)) break;
          lVar39 = lVar16 + -1;
          uVar41 = uVar25 - 1;
          cVar6 = cVar13 + -0x10;
        } while (*(char *)((long)plVar34 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
        iVar46 = (int)lVar16;
        uVar14 = (ulong)(uint)(iVar46 + (iVar21 - (int)plVar40));
        if (pcVar12 < dest + ((ulong)uVar28 + lVar16 & 0xffffffff) / 0xff + uVar14 + 9) {
          return 0;
        }
        plVar34 = (long *)(dest + 1);
        if ((uint)((ulong)uVar28 + lVar16) < 0xf) {
          *dest = cVar13;
        }
        else {
          uVar9 = (ulong)(uVar28 - 0xf) + lVar16;
          *dest = -0x10;
          if (0xfe < (int)uVar9) {
            uVar41 = 0x1fd;
            if (uVar25 < 0x1fd) {
              uVar41 = uVar25;
            }
            if (0x1fc < (int)uVar25) {
              uVar25 = 0x1fd;
            }
            memset(plVar34,0xff,(ulong)((((uVar28 + 0xef) - uVar41) + iVar46) / 0xff + 1));
            uVar41 = ((uVar28 + 0xef) - uVar25) + iVar46;
            plVar34 = (long *)(dest + (ulong)uVar41 / 0xff + 2);
            uVar9 = (ulong)((uVar28 - 0x10e) + iVar46 + (uVar41 % 0xff - uVar41));
          }
          *(char *)plVar34 = (char)uVar9;
          plVar34 = (long *)((long)plVar34 + 1);
        }
        plVar26 = (long *)(uVar14 + (long)plVar34);
        do {
          *plVar34 = *plVar40;
          plVar34 = plVar34 + 1;
          plVar40 = plVar40 + 1;
        } while (plVar34 < plVar26);
        do {
          *(short *)plVar26 = (short)plVar19 - (short)piVar27;
          puVar44 = (ulong *)((long)plVar19 + 4);
          puVar32 = (ulong *)(piVar27 + 1);
          puVar45 = puVar44;
          if (puVar44 < puVar43) {
            if (*puVar32 == *puVar44) {
              puVar32 = (ulong *)(piVar27 + 3);
              puVar45 = (ulong *)((long)plVar19 + 0xc);
              goto LAB_00107a12;
            }
            uVar14 = *puVar44 ^ *puVar32;
            lVar39 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar41 = (uint)lVar39 >> 3;
          }
          else {
LAB_00107a12:
            if (puVar45 < puVar43) {
              iVar21 = ((int)puVar45 - (int)plVar19) + -4;
LAB_00107a20:
              if (*puVar32 == *puVar45) goto code_r0x00107a2c;
              uVar9 = *puVar45 ^ *puVar32;
              uVar14 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar41 = ((uint)(uVar14 >> 3) & 0x1fffffff) + iVar21;
              goto LAB_00107aa2;
            }
LAB_00107a3c:
            if ((puVar45 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar32 == (int)*puVar45)) {
              puVar45 = (ulong *)((long)puVar45 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar45 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar32 == (short)*puVar45)) {
              puVar45 = (ulong *)((long)puVar45 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar45 < source + ((ulong)(uint)inputSize - 5)) {
              puVar45 = (ulong *)((long)puVar45 + (ulong)((char)*puVar32 == (char)*puVar45));
            }
            uVar41 = (int)puVar45 - (int)puVar44;
          }
LAB_00107aa2:
          if (pcVar12 < (char *)((long)plVar26 + (ulong)(uVar41 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          pcVar10 = (char *)((long)plVar26 + 2);
          if (uVar41 < 0xf) {
            *dest = *dest + (char)uVar41;
            dest = pcVar10;
          }
          else {
            *dest = *dest + '\x0f';
            uVar23 = (ushort)(uVar41 - 0xf);
            pcVar10[0] = -1;
            pcVar10[1] = -1;
            pcVar10[2] = -1;
            pcVar10[3] = -1;
            if (0x3fb < uVar41 - 0xf) {
              uVar23 = (ushort)((ulong)(uVar41 - 0x40b) % 0x3fc);
              uVar14 = (ulong)((uVar41 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)plVar26 + 6),0xff,uVar14 + 4);
              pcVar10 = (char *)((long)plVar26 + uVar14 + 6);
            }
            pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
            dest = pcVar10 + uVar23 / 0xff + 1;
          }
          lVar39 = (long)plVar19 + (ulong)uVar41;
          plVar40 = (long *)(lVar39 + 4);
          if (plVar8 <= plVar40) break;
          *(int *)((long)LZ4_stream +
                  ((ulong)(*(long *)(lVar39 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)lVar39 + 2) - iVar24;
          uVar14 = (ulong)(*plVar40 * -0x30e4432345000000) >> 0x34;
          uVar28 = (int)plVar40 - iVar24;
          uVar41 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar28;
          if ((uVar41 + 0xffff < uVar28) ||
             (piVar27 = (int *)((ulong)uVar41 + lVar42), *piVar27 != *(int *)plVar40))
          goto LAB_00107bcc;
          plVar26 = (long *)(dest + 1);
          *dest = '\0';
          plVar19 = plVar40;
        } while( true );
      }
LAB_00107bf7:
      pcVar10 = source + ((ulong)(uint)inputSize - (long)plVar40);
      if (pcVar12 < dest + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1)) {
        return 0;
      }
      if (pcVar10 < (char *)0xf) {
        *dest = (char)pcVar10 << 4;
        goto LAB_001098e5;
      }
      *dest = -0x10;
      pcVar12 = dest;
    }
    cVar6 = (char)(pcVar10 + -0xf);
    dest = pcVar12 + 1;
    if ((char *)0xfe < pcVar10 + -0xf) {
      uVar11 = (ulong)(pcVar10 + -0x10e) / 0xff;
      memset(dest,0xff,uVar11 + 1);
      cVar6 = (char)uVar11 + (char)pcVar10 + -0xe;
      dest = pcVar12 + uVar11 + 2;
    }
    *dest = cVar6;
LAB_001098e5:
    memcpy(dest + 1,plVar40,(size_t)pcVar10);
    return ((int)(dest + 1) + (int)pcVar10) - iVar3;
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  puVar43 = (ulong *)source;
  if (__src != (LZ4_stream_t_internal *)0x0) {
    if (0x1000 < inputSize) {
      memcpy(LZ4_stream,__src,0x4020);
      uVar25 = 0;
      if ((uint)inputSize < 0x7e000001) {
        uVar41 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar7 = (long)source - (ulong)uVar41;
        piVar27 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        lVar39 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar27;
        lVar42 = lVar39 - (ulong)uVar41;
        pcVar12 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize =
             (LZ4_stream->internal_donotuse).dictSize + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = inputSize + uVar41;
        (LZ4_stream->internal_donotuse).tableType = 2;
        puVar44 = (ulong *)(source + 2);
        puVar32 = (ulong *)(source + 1);
        uVar28 = uVar41 + 1;
        puVar45 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
        puVar33 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar27 == (int *)0x0) {
          lVar42 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar41;
        if (piVar27 == (int *)0x0) {
          lVar39 = 0;
        }
        puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00106d10:
        uVar11 = *(ulong *)((long)puVar43 + 1);
        uVar20 = acceleration;
        uVar25 = acceleration * 0x40;
        do {
          uVar25 = uVar25 + 1;
          uVar14 = uVar11 * -0x30e4432345000000 >> 0x34;
          uVar36 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          uVar11 = *puVar44;
          *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar28;
          iVar21 = (int)lVar7;
          if (uVar28 <= uVar36 + 0xffff) {
            lVar16 = lVar42;
            if (uVar41 <= uVar36) {
              lVar16 = lVar7;
            }
            if (*(int *)(lVar16 + (ulong)uVar36) == (int)*puVar32) goto LAB_00106d7a;
          }
          uVar28 = (int)puVar44 - iVar21;
          puVar15 = (ulong *)((ulong)uVar20 + (long)puVar44);
          uVar20 = uVar25 >> 6;
          puVar32 = puVar44;
          puVar44 = puVar15;
          if (puVar45 < puVar15) goto LAB_001097db;
        } while( true );
      }
      goto LAB_001098a3;
    }
    uVar25 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_001098a3;
    if (inputSize != 0) {
      uVar41 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar27 = (int *)__src->dictionary;
      uVar28 = __src->currentOffset;
      lVar39 = (ulong)__src->dictSize + (long)piVar27;
      lVar42 = lVar39 - (ulong)uVar28;
      if (piVar27 == (int *)0x0) {
        lVar42 = 0;
      }
      LZ4_stream->table[0x802] = (void *)0x0;
      pcVar12 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar41 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar7 = (long)source - (ulong)uVar41;
        iVar21 = uVar41 - uVar28;
        puVar44 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
        puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar27 == (int *)0x0) {
          lVar39 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar41;
        puVar45 = (ulong *)(source + 2);
        puVar33 = (ulong *)(source + 1);
        uVar28 = uVar41 + 1;
        puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00107d08:
        uVar11 = *(ulong *)((long)puVar43 + 1);
        uVar20 = acceleration;
        uVar25 = acceleration * 0x40;
        while( true ) {
          uVar25 = uVar25 + 1;
          uVar14 = uVar11 * -0x30e4432345000000 >> 0x34;
          uVar36 = *(uint *)((long)LZ4_stream + uVar14 * 4);
          if (uVar36 < uVar41) {
            uVar36 = __src->hashTable[uVar14] + iVar21;
            piVar37 = (int *)((ulong)__src->hashTable[uVar14] + lVar42);
            piVar22 = piVar27;
          }
          else {
            piVar37 = (int *)(lVar7 + (ulong)uVar36);
            piVar22 = (int *)source;
          }
          uVar11 = *puVar45;
          *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar28;
          iVar24 = (int)lVar7;
          if ((uVar28 <= uVar36 + 0xffff) && (*piVar37 == (int)*puVar33)) break;
          uVar28 = (int)puVar45 - iVar24;
          puVar15 = (ulong *)((ulong)uVar20 + (long)puVar45);
          uVar20 = uVar25 >> 6;
          puVar33 = puVar45;
          puVar45 = puVar15;
          if (puVar44 < puVar15) goto LAB_001075aa;
        }
        iVar46 = uVar28 - uVar36;
        uVar20 = (int)puVar33 - (int)puVar43;
        lVar16 = 0;
        uVar28 = uVar20 - 0xf;
        cVar6 = (char)puVar33 * '\x10' + (char)puVar43 * -0x10;
        do {
          cVar13 = cVar6;
          uVar36 = uVar28;
          lVar30 = lVar16;
          piVar38 = (int *)((long)piVar37 + lVar30);
          puVar45 = (ulong *)((long)puVar33 + lVar30);
          if ((piVar38 <= piVar22) || (puVar45 <= puVar43)) break;
          lVar16 = lVar30 + -1;
          uVar28 = uVar36 - 1;
          cVar6 = cVar13 + -0x10;
        } while (*(char *)((long)puVar33 + lVar30 + -1) == *(char *)((long)piVar37 + lVar30 + -1));
        iVar5 = (int)lVar30;
        uVar11 = (ulong)(uint)(((int)puVar33 - (int)puVar43) + iVar5);
        uVar25 = 0;
        if (dest + ((ulong)uVar20 + lVar30 & 0xffffffff) / 0xff + uVar11 + 9 <= pcVar12) {
          puVar33 = (ulong *)(dest + 1);
          local_58 = (uint)((ulong)uVar20 + lVar30);
          if (local_58 < 0xf) {
            *dest = cVar13;
          }
          else {
            uVar14 = (ulong)(uVar20 - 0xf) + lVar30;
            *dest = -0x10;
            if (0xfe < (int)uVar14) {
              uVar28 = 0x1fd;
              if (uVar36 < 0x1fd) {
                uVar28 = uVar36;
              }
              if (0x1fc < (int)uVar36) {
                uVar36 = 0x1fd;
              }
              memset(puVar33,0xff,(ulong)((((uVar20 + 0xef) - uVar28) + iVar5) / 0xff + 1));
              uVar28 = ((uVar20 + 0xef) - uVar36) + iVar5;
              puVar33 = (ulong *)(dest + (ulong)uVar28 / 0xff + 2);
              uVar14 = (ulong)((uVar20 - 0x10e) + iVar5 + (uVar28 % 0xff - uVar28));
            }
            *(char *)puVar33 = (char)uVar14;
            puVar33 = (ulong *)((long)puVar33 + 1);
          }
          puVar15 = (ulong *)(uVar11 + (long)puVar33);
          do {
            *puVar33 = *puVar43;
            puVar33 = puVar33 + 1;
            puVar43 = puVar43 + 1;
          } while (puVar33 < puVar15);
          do {
            *(short *)puVar15 = (short)iVar46;
            if (piVar22 == piVar27) {
              puVar33 = (ulong *)((lVar39 - (long)piVar38) + (long)puVar45);
              if (puVar32 < puVar33) {
                puVar33 = puVar32;
              }
              puVar43 = (ulong *)((long)puVar45 + 4);
              puVar29 = (ulong *)(piVar38 + 1);
              puVar17 = (ulong *)((long)puVar33 - 7);
              puVar18 = puVar43;
              if (puVar43 < puVar17) {
                if (*puVar29 == *puVar43) {
                  puVar29 = (ulong *)(piVar38 + 3);
                  puVar18 = (ulong *)((long)puVar45 + 0xc);
                  goto LAB_0010805d;
                }
                uVar11 = *puVar43 ^ *puVar29;
                lVar16 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                uVar28 = (uint)lVar16 >> 3;
              }
              else {
LAB_0010805d:
                if (puVar18 < puVar17) {
                  iVar46 = ((int)puVar18 - (int)puVar45) + -4;
LAB_0010806f:
                  if (*puVar29 == *puVar18) goto code_r0x0010807a;
                  uVar14 = *puVar18 ^ *puVar29;
                  uVar11 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  uVar28 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar46;
                  goto LAB_00108101;
                }
LAB_0010808b:
                if ((puVar18 < (ulong *)((long)puVar33 - 3U)) && ((int)*puVar29 == (int)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar18 < (ulong *)((long)puVar33 - 1U)) &&
                   ((short)*puVar29 == (short)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar18 < puVar33) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar29 == (char)*puVar18));
                }
                uVar28 = (int)puVar18 - (int)puVar43;
              }
LAB_00108101:
              puVar43 = (ulong *)((long)puVar45 + (ulong)uVar28 + 4);
              if (puVar43 == puVar33) {
                puVar17 = puVar33;
                puVar29 = (ulong *)source;
                if (puVar33 < puVar1) {
                  if (*(ulong *)source == *puVar33) {
                    puVar17 = puVar33 + 1;
                    puVar29 = (ulong *)(source + 8);
                    goto LAB_00108139;
                  }
                  uVar14 = *puVar33 ^ *(ulong *)source;
                  uVar11 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  uVar11 = uVar11 >> 3 & 0x1fffffff;
                }
                else {
LAB_00108139:
                  if (puVar17 < puVar1) {
                    puVar45 = (ulong *)((long)puVar45 + (lVar39 - (long)piVar38));
                    if (puVar32 <= puVar45) {
                      puVar45 = puVar32;
                    }
                    iVar46 = (int)puVar17 - (int)puVar45;
LAB_0010815b:
                    if (*puVar29 == *puVar17) goto code_r0x00108166;
                    uVar14 = *puVar17 ^ *puVar29;
                    uVar11 = 0;
                    if (uVar14 != 0) {
                      for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    uVar11 = (ulong)(((uint)(uVar11 >> 3) & 0x1fffffff) + iVar46);
                    goto LAB_001081e7;
                  }
LAB_00108177:
                  if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar29 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar29 = (ulong *)((long)puVar29 + 4);
                  }
                  if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar29 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar29 = (ulong *)((long)puVar29 + 2);
                  }
                  if (puVar17 < puVar32) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar29 == (char)*puVar17));
                  }
                  uVar11 = (ulong)(uint)((int)puVar17 - (int)puVar33);
                }
LAB_001081e7:
                uVar28 = uVar28 + (int)uVar11;
                puVar43 = (ulong *)((long)puVar43 + uVar11);
              }
            }
            else {
              puVar43 = (ulong *)((long)puVar45 + 4);
              puVar33 = (ulong *)(piVar38 + 1);
              puVar17 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar33 == *puVar43) {
                  puVar33 = (ulong *)(piVar38 + 3);
                  puVar17 = (ulong *)((long)puVar45 + 0xc);
                  goto LAB_00107f9b;
                }
                uVar11 = *puVar43 ^ *puVar33;
                lVar16 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                uVar28 = (uint)lVar16 >> 3;
              }
              else {
LAB_00107f9b:
                if (puVar17 < puVar1) {
                  iVar46 = ((int)puVar17 - (int)puVar45) + -4;
LAB_00107fa8:
                  if (*puVar33 == *puVar17) goto code_r0x00107fb7;
                  uVar14 = *puVar17 ^ *puVar33;
                  uVar11 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  uVar28 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar46;
                  goto LAB_001080cd;
                }
LAB_00107fc7:
                if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar33 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar33 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar17 < puVar32) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar33 == (char)*puVar17));
                }
                uVar28 = (int)puVar17 - (int)puVar43;
              }
LAB_001080cd:
              puVar43 = (ulong *)((long)puVar45 + (ulong)uVar28 + 4);
            }
            uVar25 = 0;
            if (pcVar12 < (char *)((long)puVar15 + (ulong)(uVar28 + 0xf0) / 0xff + 8)) break;
            pcVar10 = (char *)((long)puVar15 + 2);
            if (uVar28 < 0xf) {
              *dest = *dest + (char)uVar28;
              dest = pcVar10;
            }
            else {
              *dest = *dest + '\x0f';
              uVar23 = (ushort)(uVar28 - 0xf);
              pcVar10[0] = -1;
              pcVar10[1] = -1;
              pcVar10[2] = -1;
              pcVar10[3] = -1;
              if (0x3fb < uVar28 - 0xf) {
                uVar23 = (ushort)((ulong)(uVar28 - 0x40b) % 0x3fc);
                uVar11 = (ulong)((uVar28 - 0x40b) / 0x3fc << 2);
                memset((char *)((long)puVar15 + 6),0xff,uVar11 + 4);
                pcVar10 = (char *)((long)puVar15 + uVar11 + 6);
              }
              pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
              dest = pcVar10 + uVar23 / 0xff + 1;
            }
            if (puVar44 <= puVar43) goto LAB_001075aa;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar43 + -2) - iVar24;
            uVar11 = *puVar43 * -0x30e4432345000000 >> 0x34;
            uVar28 = *(uint *)((long)LZ4_stream + uVar11 * 4);
            if (uVar28 < uVar41) {
              uVar28 = iVar21 + __src->hashTable[uVar11];
              piVar38 = (int *)((ulong)__src->hashTable[uVar11] + lVar42);
              piVar22 = piVar27;
            }
            else {
              piVar38 = (int *)(lVar7 + (ulong)uVar28);
              piVar22 = (int *)source;
            }
            uVar25 = (int)puVar43 - iVar24;
            *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar25;
            if ((uVar28 + 0xffff < uVar25) || (*piVar38 != (int)*puVar43)) goto LAB_001083f1;
            puVar15 = (ulong *)(dest + 1);
            *dest = '\0';
            iVar46 = uVar25 - uVar28;
            puVar45 = puVar43;
          } while( true );
        }
        goto LAB_001098a3;
      }
LAB_001075aa:
      pcVar10 = source + ((ulong)(uint)inputSize - (long)puVar43);
      uVar25 = 0;
      if (pcVar12 < dest + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1)) goto LAB_001098a3;
      if (pcVar10 < (char *)0xf) {
        *dest = (char)pcVar10 << 4;
      }
      else {
        pcVar12 = pcVar10 + -0xf;
        *dest = -0x10;
        pcVar35 = dest + 1;
        if ((char *)0xfe < pcVar12) {
          uVar11 = (ulong)(pcVar10 + -0x10e) / 0xff;
          memset(pcVar35,0xff,uVar11 + 1);
          pcVar12 = pcVar10 + uVar11 * -0xff + -0x10e;
          pcVar35 = dest + uVar11 + 2;
        }
        *pcVar35 = (char)pcVar12;
        dest = pcVar35;
      }
      pcVar12 = dest + 1;
      goto LAB_00109890;
    }
LAB_00107764:
    uVar25 = 0;
    if (0 < maxOutputSize) {
      *dest = '\0';
      uVar25 = 1;
    }
    goto LAB_001098a3;
  }
  pcVar12 = dest;
  if (uVar41 < 0x10000) {
    uVar28 = (LZ4_stream->internal_donotuse).currentOffset;
    if (uVar28 <= uVar41) goto LAB_00107646;
    uVar25 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_001098a3;
    if (inputSize == 0) goto LAB_00107764;
    lVar39 = uVar11 + (long)piVar37;
    lVar42 = lVar39 - (ulong)uVar28;
    if (piVar37 == (int *)0x0) {
      lVar42 = 0;
    }
    (LZ4_stream->internal_donotuse).dictSize = uVar41 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = inputSize + uVar28;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < (uint)inputSize) {
      lVar7 = (long)source - (ulong)uVar28;
      puVar44 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
      puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
      if (piVar37 == (int *)0x0) {
        lVar39 = 0;
      }
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar28;
      puVar45 = (ulong *)(source + 2);
      puVar33 = (ulong *)(source + 1);
      uVar25 = uVar28 + 1;
      puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00109158:
      uVar11 = *(ulong *)((long)puVar43 + 1);
      uVar36 = acceleration;
      uVar20 = acceleration * 0x40;
      do {
        uVar20 = uVar20 + 1;
        uVar14 = uVar11 * -0x30e4432345000000 >> 0x34;
        uVar2 = *(uint *)((long)LZ4_stream + uVar14 * 4);
        uVar11 = *puVar45;
        *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar25;
        local_c8 = (int)lVar7;
        if ((uVar28 - uVar41 <= uVar2) && (uVar25 <= uVar2 + 0xffff)) {
          lVar16 = lVar42;
          if (uVar28 <= uVar2) {
            lVar16 = lVar7;
          }
          if (*(int *)(lVar16 + (ulong)uVar2) == (int)*puVar33) goto LAB_001091d7;
        }
        uVar25 = (int)puVar45 - local_c8;
        puVar15 = (ulong *)((ulong)uVar36 + (long)puVar45);
        uVar36 = uVar20 >> 6;
        puVar33 = puVar45;
        puVar45 = puVar15;
        if (puVar44 < puVar15) break;
      } while( true );
    }
  }
  else {
LAB_00107646:
    uVar25 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_001098a3;
    if (inputSize == 0) goto LAB_00107764;
    uVar28 = (LZ4_stream->internal_donotuse).currentOffset;
    lVar39 = uVar11 + (long)piVar37;
    lVar42 = lVar39 - (ulong)uVar28;
    if (piVar37 == (int *)0x0) {
      lVar42 = 0;
    }
    (LZ4_stream->internal_donotuse).dictSize = uVar41 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar28 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < (uint)inputSize) {
      lVar7 = (long)source - (ulong)uVar28;
      puVar44 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
      puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
      if (piVar37 == (int *)0x0) {
        lVar39 = 0;
      }
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar28;
      puVar45 = (ulong *)(source + 2);
      puVar33 = (ulong *)(source + 1);
      uVar41 = uVar28 + 1;
      puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_001084bd:
      uVar11 = *(ulong *)((long)puVar43 + 1);
      uVar20 = acceleration;
      uVar25 = acceleration * 0x40;
      do {
        uVar25 = uVar25 + 1;
        uVar14 = uVar11 * -0x30e4432345000000 >> 0x34;
        uVar36 = *(uint *)((long)LZ4_stream + uVar14 * 4);
        uVar11 = *puVar45;
        *(uint *)((long)LZ4_stream + uVar14 * 4) = uVar41;
        local_c8 = (int)lVar7;
        if (uVar41 <= uVar36 + 0xffff) {
          lVar16 = lVar42;
          if (uVar28 <= uVar36) {
            lVar16 = lVar7;
          }
          if (*(int *)(lVar16 + (ulong)uVar36) == (int)*puVar33) goto LAB_0010852d;
        }
        uVar41 = (int)puVar45 - local_c8;
        puVar15 = (ulong *)((ulong)uVar20 + (long)puVar45);
        uVar20 = uVar25 >> 6;
        puVar33 = puVar45;
        puVar45 = puVar15;
        if (puVar44 < puVar15) break;
      } while( true );
    }
  }
LAB_001076cd:
  local_d8 = dest + maxOutputSize;
  pcVar10 = source + ((ulong)(uint)inputSize - (long)puVar43);
  uVar25 = 0;
  if (local_d8 < pcVar12 + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1)) goto LAB_001098a3;
  if (pcVar10 < (char *)0xf) {
    *pcVar12 = (char)pcVar10 << 4;
  }
  else {
    pcVar35 = pcVar10 + -0xf;
    *pcVar12 = -0x10;
    __s = pcVar12 + 1;
    if ((char *)0xfe < pcVar35) {
      uVar11 = (ulong)(pcVar10 + -0x10e) / 0xff;
      memset(__s,0xff,uVar11 + 1);
      pcVar35 = pcVar10 + uVar11 * -0xff + -0x10e;
      __s = pcVar12 + uVar11 + 2;
    }
    *__s = (char)pcVar35;
    pcVar12 = __s;
  }
  pcVar12 = pcVar12 + 1;
LAB_00109890:
  memcpy(pcVar12,puVar43,(size_t)pcVar10);
  uVar25 = ((int)pcVar12 + (int)pcVar10) - iVar3;
LAB_001098a3:
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return uVar25;
code_r0x00107a2c:
  puVar45 = puVar45 + 1;
  puVar32 = puVar32 + 1;
  iVar21 = iVar21 + 8;
  if (puVar43 <= puVar45) goto LAB_00107a3c;
  goto LAB_00107a20;
LAB_00107bcc:
  plVar19 = (long *)(lVar39 + 6);
  if (plVar8 < plVar19) goto LAB_00107bf7;
  goto LAB_00107813;
code_r0x00108e4e:
  puVar45 = puVar45 + 1;
  puVar32 = puVar32 + 1;
  iVar21 = iVar21 + 8;
  if (puVar43 <= puVar45) goto LAB_00108e5e;
  goto LAB_00108e43;
LAB_00108fec:
  plVar19 = (long *)(lVar39 + 6);
  if (plVar8 < plVar19) goto LAB_0010901a;
  goto LAB_00108c2e;
LAB_001091d7:
  lVar16 = lVar16 + (ulong)uVar2;
  piVar27 = (int *)source;
  if (uVar2 < uVar28) {
    piVar27 = piVar37;
  }
  iVar21 = uVar25 - uVar2;
  uVar20 = (int)puVar33 - (int)puVar43;
  lVar30 = 0;
  uVar25 = uVar20 - 0xf;
  cVar6 = (char)puVar33 * '\x10' + (char)puVar43 * -0x10;
  do {
    cVar13 = cVar6;
    uVar36 = uVar25;
    lVar31 = lVar30;
    piVar22 = (int *)(lVar16 + lVar31);
    puVar45 = (ulong *)((long)puVar33 + lVar31);
    if ((piVar22 <= piVar27) || (puVar45 <= puVar43)) break;
    lVar30 = lVar31 + -1;
    uVar25 = uVar36 - 1;
    cVar6 = cVar13 + -0x10;
  } while (*(char *)((long)puVar33 + lVar31 + -1) == *(char *)(lVar16 + -1 + lVar31));
  iVar24 = (int)lVar31;
  uVar11 = (ulong)(uint)(((int)puVar33 - (int)puVar43) + iVar24);
  uVar25 = 0;
  if (pcVar12 + ((ulong)uVar20 + lVar31 & 0xffffffff) / 0xff + uVar11 + 9 <= dest + maxOutputSize) {
    puVar33 = (ulong *)(pcVar12 + 1);
    if ((uint)((ulong)uVar20 + lVar31) < 0xf) {
      *pcVar12 = cVar13;
    }
    else {
      uVar14 = (ulong)(uVar20 - 0xf) + lVar31;
      *pcVar12 = -0x10;
      if (0xfe < (int)uVar14) {
        uVar25 = 0x1fd;
        if (uVar36 < 0x1fd) {
          uVar25 = uVar36;
        }
        if (0x1fc < (int)uVar36) {
          uVar36 = 0x1fd;
        }
        memset(puVar33,0xff,(ulong)((((uVar20 + 0xef) - uVar25) + iVar24) / 0xff + 1));
        uVar25 = ((uVar20 + 0xef) - uVar36) + iVar24;
        puVar33 = (ulong *)(pcVar12 + (ulong)uVar25 / 0xff + 2);
        uVar14 = (ulong)((uVar20 - 0x10e) + iVar24 + (uVar25 % 0xff - uVar25));
      }
      *(char *)puVar33 = (char)uVar14;
      puVar33 = (ulong *)((long)puVar33 + 1);
    }
    puVar15 = (ulong *)(uVar11 + (long)puVar33);
    do {
      *puVar33 = *puVar43;
      puVar33 = puVar33 + 1;
      puVar43 = puVar43 + 1;
    } while (puVar33 < puVar15);
    do {
      *(short *)puVar15 = (short)iVar21;
      if (piVar27 == piVar37) {
        puVar33 = (ulong *)((lVar39 - (long)piVar22) + (long)puVar45);
        if (puVar32 < puVar33) {
          puVar33 = puVar32;
        }
        puVar43 = (ulong *)((long)puVar45 + 4);
        puVar29 = (ulong *)(piVar22 + 1);
        puVar17 = (ulong *)((long)puVar33 - 7);
        puVar18 = puVar43;
        if (puVar43 < puVar17) {
          if (*puVar29 == *puVar43) {
            puVar29 = (ulong *)(piVar22 + 3);
            puVar18 = (ulong *)((long)puVar45 + 0xc);
            goto LAB_0010947d;
          }
          uVar11 = *puVar43 ^ *puVar29;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar20 = (uint)lVar16 >> 3;
        }
        else {
LAB_0010947d:
          if (puVar18 < puVar17) {
            iVar21 = ((int)puVar18 - (int)puVar45) + -4;
LAB_0010948f:
            if (*puVar29 == *puVar18) goto code_r0x0010949e;
            uVar14 = *puVar18 ^ *puVar29;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar20 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_0010954b;
          }
LAB_001094af:
          if ((puVar18 < (ulong *)((long)puVar33 - 3U)) && ((int)*puVar29 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar18 < (ulong *)((long)puVar33 - 1U)) && ((short)*puVar29 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar18 < puVar33) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar29 == (char)*puVar18));
          }
          uVar20 = (int)puVar18 - (int)puVar43;
        }
LAB_0010954b:
        puVar43 = (ulong *)((long)puVar45 + (ulong)uVar20 + 4);
        if (puVar43 == puVar33) {
          puVar17 = puVar33;
          puVar29 = (ulong *)source;
          if (puVar33 < puVar1) {
            if (*(ulong *)source == *puVar33) {
              puVar17 = puVar33 + 1;
              puVar29 = (ulong *)(source + 8);
              goto LAB_00109583;
            }
            uVar14 = *puVar33 ^ *(ulong *)source;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = uVar11 >> 3 & 0x1fffffff;
          }
          else {
LAB_00109583:
            if (puVar17 < puVar1) {
              puVar45 = (ulong *)((long)puVar45 + (lVar39 - (long)piVar22));
              if (puVar32 <= puVar45) {
                puVar45 = puVar32;
              }
              iVar21 = (int)puVar17 - (int)puVar45;
LAB_001095a5:
              if (*puVar29 == *puVar17) goto code_r0x001095b0;
              uVar14 = *puVar17 ^ *puVar29;
              uVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = (ulong)(((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21);
              goto LAB_0010962d;
            }
LAB_001095c1:
            if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar29 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar29 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar17 < puVar32) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar29 == (char)*puVar17));
            }
            uVar11 = (ulong)(uint)((int)puVar17 - (int)puVar33);
          }
LAB_0010962d:
          uVar20 = uVar20 + (int)uVar11;
          puVar43 = (ulong *)((long)puVar43 + uVar11);
        }
      }
      else {
        puVar43 = (ulong *)((long)puVar45 + 4);
        puVar33 = (ulong *)(piVar22 + 1);
        puVar17 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar33 == *puVar43) {
            puVar33 = (ulong *)(piVar22 + 3);
            puVar17 = (ulong *)((long)puVar45 + 0xc);
            goto LAB_001093c1;
          }
          uVar11 = *puVar43 ^ *puVar33;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar20 = (uint)lVar16 >> 3;
        }
        else {
LAB_001093c1:
          if (puVar17 < puVar1) {
            iVar21 = ((int)puVar17 - (int)puVar45) + -4;
LAB_001093ce:
            if (*puVar33 == *puVar17) goto code_r0x001093dd;
            uVar14 = *puVar17 ^ *puVar33;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar20 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_0010951c;
          }
LAB_001093ed:
          if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar33 == (int)*puVar17))
          {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar33 = (ulong *)((long)puVar33 + 4);
          }
          if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar33 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar33 = (ulong *)((long)puVar33 + 2);
          }
          if (puVar17 < puVar32) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar33 == (char)*puVar17));
          }
          uVar20 = (int)puVar17 - (int)puVar43;
        }
LAB_0010951c:
        puVar43 = (ulong *)((long)puVar45 + (ulong)uVar20 + 4);
      }
      uVar25 = 0;
      if (dest + maxOutputSize < (char *)((long)puVar15 + (ulong)(uVar20 + 0xf0) / 0xff + 8)) break;
      pcVar10 = (char *)((long)puVar15 + 2);
      if (uVar20 < 0xf) {
        *pcVar12 = *pcVar12 + (char)uVar20;
        pcVar12 = pcVar10;
      }
      else {
        *pcVar12 = *pcVar12 + '\x0f';
        uVar23 = (ushort)(uVar20 - 0xf);
        pcVar10[0] = -1;
        pcVar10[1] = -1;
        pcVar10[2] = -1;
        pcVar10[3] = -1;
        if (0x3fb < uVar20 - 0xf) {
          uVar23 = (ushort)((ulong)(uVar20 - 0x40b) % 0x3fc);
          uVar11 = (ulong)((uVar20 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar15 + 6),0xff,uVar11 + 4);
          pcVar10 = (char *)((long)puVar15 + uVar11 + 6);
        }
        pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
        pcVar12 = pcVar10 + uVar23 / 0xff + 1;
      }
      if (puVar44 <= puVar43) goto LAB_001076cd;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar43 + -2) - local_c8;
      uVar11 = *puVar43 * -0x30e4432345000000 >> 0x34;
      uVar20 = (int)puVar43 - local_c8;
      uVar25 = *(uint *)((long)LZ4_stream + uVar11 * 4);
      piVar27 = (int *)source;
      lVar16 = lVar7;
      if (uVar25 < uVar28) {
        piVar27 = piVar37;
        lVar16 = lVar42;
      }
      *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar20;
      if (((uVar25 < uVar28 - uVar41) || (uVar25 + 0xffff < uVar20)) ||
         (piVar22 = (int *)(lVar16 + (ulong)uVar25), *piVar22 != (int)*puVar43)) goto LAB_001097a7;
      puVar15 = (ulong *)(pcVar12 + 1);
      *pcVar12 = '\0';
      iVar21 = uVar20 - uVar25;
      puVar45 = puVar43;
    } while( true );
  }
  goto LAB_001098a3;
code_r0x0010949e:
  puVar18 = puVar18 + 1;
  puVar29 = puVar29 + 1;
  iVar21 = iVar21 + 8;
  if (puVar17 <= puVar18) goto LAB_001094af;
  goto LAB_0010948f;
code_r0x001095b0:
  puVar17 = puVar17 + 1;
  puVar29 = puVar29 + 1;
  iVar21 = iVar21 + 8;
  if (puVar1 <= puVar17) goto LAB_001095c1;
  goto LAB_001095a5;
code_r0x001093dd:
  puVar17 = puVar17 + 1;
  puVar33 = puVar33 + 1;
  iVar21 = iVar21 + 8;
  if (puVar1 <= puVar17) goto LAB_001093ed;
  goto LAB_001093ce;
LAB_001097a7:
  puVar33 = (ulong *)((long)puVar43 + 1);
  uVar25 = (int)puVar33 - local_c8;
  puVar45 = (ulong *)((long)puVar43 + 2);
  if (puVar44 < puVar45) goto LAB_001076cd;
  goto LAB_00109158;
LAB_0010852d:
  lVar16 = lVar16 + (ulong)uVar36;
  piVar27 = (int *)source;
  if (uVar36 < uVar28) {
    piVar27 = piVar37;
  }
  iVar21 = uVar41 - uVar36;
  uVar20 = (int)puVar33 - (int)puVar43;
  lVar30 = 0;
  uVar41 = uVar20 - 0xf;
  cVar6 = (char)puVar33 * '\x10' + (char)puVar43 * -0x10;
  do {
    cVar13 = cVar6;
    uVar36 = uVar41;
    lVar31 = lVar30;
    piVar22 = (int *)(lVar16 + lVar31);
    puVar45 = (ulong *)((long)puVar33 + lVar31);
    if ((piVar22 <= piVar27) || (puVar45 <= puVar43)) break;
    lVar30 = lVar31 + -1;
    uVar41 = uVar36 - 1;
    cVar6 = cVar13 + -0x10;
  } while (*(char *)((long)puVar33 + lVar31 + -1) == *(char *)(lVar16 + -1 + lVar31));
  iVar24 = (int)lVar31;
  uVar11 = (ulong)(uint)(((int)puVar33 - (int)puVar43) + iVar24);
  uVar25 = 0;
  if (pcVar12 + ((ulong)uVar20 + lVar31 & 0xffffffff) / 0xff + uVar11 + 9 <= dest + maxOutputSize) {
    puVar33 = (ulong *)(pcVar12 + 1);
    if ((uint)((ulong)uVar20 + lVar31) < 0xf) {
      *pcVar12 = cVar13;
    }
    else {
      uVar14 = (ulong)(uVar20 - 0xf) + lVar31;
      *pcVar12 = -0x10;
      if (0xfe < (int)uVar14) {
        uVar41 = 0x1fd;
        if (uVar36 < 0x1fd) {
          uVar41 = uVar36;
        }
        if (0x1fc < (int)uVar36) {
          uVar36 = 0x1fd;
        }
        memset(puVar33,0xff,(ulong)((((uVar20 + 0xef) - uVar41) + iVar24) / 0xff + 1));
        uVar41 = ((uVar20 + 0xef) - uVar36) + iVar24;
        puVar33 = (ulong *)(pcVar12 + (ulong)uVar41 / 0xff + 2);
        uVar14 = (ulong)((uVar20 - 0x10e) + iVar24 + (uVar41 % 0xff - uVar41));
      }
      *(char *)puVar33 = (char)uVar14;
      puVar33 = (ulong *)((long)puVar33 + 1);
    }
    puVar15 = (ulong *)(uVar11 + (long)puVar33);
    do {
      *puVar33 = *puVar43;
      puVar33 = puVar33 + 1;
      puVar43 = puVar43 + 1;
    } while (puVar33 < puVar15);
    do {
      *(short *)puVar15 = (short)iVar21;
      if (piVar27 == piVar37) {
        puVar33 = (ulong *)((lVar39 - (long)piVar22) + (long)puVar45);
        if (puVar32 < puVar33) {
          puVar33 = puVar32;
        }
        puVar43 = (ulong *)((long)puVar45 + 4);
        puVar29 = (ulong *)(piVar22 + 1);
        puVar17 = (ulong *)((long)puVar33 - 7);
        puVar18 = puVar43;
        if (puVar43 < puVar17) {
          if (*puVar29 == *puVar43) {
            puVar29 = (ulong *)(piVar22 + 3);
            puVar18 = (ulong *)((long)puVar45 + 0xc);
            goto LAB_001087ce;
          }
          uVar11 = *puVar43 ^ *puVar29;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar41 = (uint)lVar16 >> 3;
        }
        else {
LAB_001087ce:
          if (puVar18 < puVar17) {
            iVar21 = ((int)puVar18 - (int)puVar45) + -4;
LAB_001087e0:
            if (*puVar29 == *puVar18) goto code_r0x001087ef;
            uVar14 = *puVar18 ^ *puVar29;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar41 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_00108890;
          }
LAB_00108800:
          if ((puVar18 < (ulong *)((long)puVar33 - 3U)) && ((int)*puVar29 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar18 < (ulong *)((long)puVar33 - 1U)) && ((short)*puVar29 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar18 < puVar33) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar29 == (char)*puVar18));
          }
          uVar41 = (int)puVar18 - (int)puVar43;
        }
LAB_00108890:
        puVar43 = (ulong *)((long)puVar45 + (ulong)uVar41 + 4);
        if (puVar43 == puVar33) {
          puVar17 = puVar33;
          puVar29 = (ulong *)source;
          if (puVar33 < puVar1) {
            if (*(ulong *)source == *puVar33) {
              puVar17 = puVar33 + 1;
              puVar29 = (ulong *)(source + 8);
              goto LAB_001088c8;
            }
            uVar14 = *puVar33 ^ *(ulong *)source;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = uVar11 >> 3 & 0x1fffffff;
          }
          else {
LAB_001088c8:
            if (puVar17 < puVar1) {
              puVar45 = (ulong *)((long)puVar45 + (lVar39 - (long)piVar22));
              if (puVar32 <= puVar45) {
                puVar45 = puVar32;
              }
              iVar21 = (int)puVar17 - (int)puVar45;
LAB_001088ea:
              if (*puVar29 == *puVar17) goto code_r0x001088f5;
              uVar14 = *puVar17 ^ *puVar29;
              uVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = (ulong)(((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21);
              goto LAB_00108972;
            }
LAB_00108906:
            if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar29 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar29 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar17 < puVar32) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar29 == (char)*puVar17));
            }
            uVar11 = (ulong)(uint)((int)puVar17 - (int)puVar33);
          }
LAB_00108972:
          uVar41 = uVar41 + (int)uVar11;
          puVar43 = (ulong *)((long)puVar43 + uVar11);
        }
      }
      else {
        puVar43 = (ulong *)((long)puVar45 + 4);
        puVar33 = (ulong *)(piVar22 + 1);
        puVar17 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar33 == *puVar43) {
            puVar33 = (ulong *)(piVar22 + 3);
            puVar17 = (ulong *)((long)puVar45 + 0xc);
            goto LAB_00108712;
          }
          uVar11 = *puVar43 ^ *puVar33;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar41 = (uint)lVar16 >> 3;
        }
        else {
LAB_00108712:
          if (puVar17 < puVar1) {
            iVar21 = ((int)puVar17 - (int)puVar45) + -4;
LAB_0010871f:
            if (*puVar33 == *puVar17) goto code_r0x0010872e;
            uVar14 = *puVar17 ^ *puVar33;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar41 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_00108861;
          }
LAB_0010873e:
          if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar33 == (int)*puVar17))
          {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar33 = (ulong *)((long)puVar33 + 4);
          }
          if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar33 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar33 = (ulong *)((long)puVar33 + 2);
          }
          if (puVar17 < puVar32) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar33 == (char)*puVar17));
          }
          uVar41 = (int)puVar17 - (int)puVar43;
        }
LAB_00108861:
        puVar43 = (ulong *)((long)puVar45 + (ulong)uVar41 + 4);
      }
      uVar25 = 0;
      if (dest + maxOutputSize < (char *)((long)puVar15 + (ulong)(uVar41 + 0xf0) / 0xff + 8)) break;
      pcVar10 = (char *)((long)puVar15 + 2);
      if (uVar41 < 0xf) {
        *pcVar12 = *pcVar12 + (char)uVar41;
        pcVar12 = pcVar10;
      }
      else {
        *pcVar12 = *pcVar12 + '\x0f';
        uVar23 = (ushort)(uVar41 - 0xf);
        pcVar10[0] = -1;
        pcVar10[1] = -1;
        pcVar10[2] = -1;
        pcVar10[3] = -1;
        if (0x3fb < uVar41 - 0xf) {
          uVar23 = (ushort)((ulong)(uVar41 - 0x40b) % 0x3fc);
          uVar11 = (ulong)((uVar41 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar15 + 6),0xff,uVar11 + 4);
          pcVar10 = (char *)((long)puVar15 + uVar11 + 6);
        }
        pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
        pcVar12 = pcVar10 + uVar23 / 0xff + 1;
      }
      if (puVar44 <= puVar43) goto LAB_001076cd;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar43 + -2) - local_c8;
      uVar11 = *puVar43 * -0x30e4432345000000 >> 0x34;
      uVar25 = (int)puVar43 - local_c8;
      uVar41 = *(uint *)((long)LZ4_stream + uVar11 * 4);
      piVar27 = (int *)source;
      lVar16 = lVar7;
      if (uVar41 < uVar28) {
        piVar27 = piVar37;
        lVar16 = lVar42;
      }
      *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar25;
      if ((uVar41 + 0xffff < uVar25) ||
         (piVar22 = (int *)(lVar16 + (ulong)uVar41), *piVar22 != (int)*puVar43)) goto LAB_00108b28;
      puVar15 = (ulong *)(pcVar12 + 1);
      *pcVar12 = '\0';
      iVar21 = uVar25 - uVar41;
      puVar45 = puVar43;
    } while( true );
  }
  goto LAB_001098a3;
code_r0x001087ef:
  puVar18 = puVar18 + 1;
  puVar29 = puVar29 + 1;
  iVar21 = iVar21 + 8;
  if (puVar17 <= puVar18) goto LAB_00108800;
  goto LAB_001087e0;
code_r0x001088f5:
  puVar17 = puVar17 + 1;
  puVar29 = puVar29 + 1;
  iVar21 = iVar21 + 8;
  if (puVar1 <= puVar17) goto LAB_00108906;
  goto LAB_001088ea;
code_r0x0010872e:
  puVar17 = puVar17 + 1;
  puVar33 = puVar33 + 1;
  iVar21 = iVar21 + 8;
  if (puVar1 <= puVar17) goto LAB_0010873e;
  goto LAB_0010871f;
LAB_00108b28:
  puVar33 = (ulong *)((long)puVar43 + 1);
  uVar41 = (int)puVar33 - local_c8;
  puVar45 = (ulong *)((long)puVar43 + 2);
  if (puVar44 < puVar45) goto LAB_001076cd;
  goto LAB_001084bd;
code_r0x0010807a:
  puVar18 = puVar18 + 1;
  puVar29 = puVar29 + 1;
  iVar46 = iVar46 + 8;
  if (puVar17 <= puVar18) goto LAB_0010808b;
  goto LAB_0010806f;
code_r0x00108166:
  puVar17 = puVar17 + 1;
  puVar29 = puVar29 + 1;
  iVar46 = iVar46 + 8;
  if (puVar1 <= puVar17) goto LAB_00108177;
  goto LAB_0010815b;
code_r0x00107fb7:
  puVar17 = puVar17 + 1;
  puVar33 = puVar33 + 1;
  iVar46 = iVar46 + 8;
  if (puVar1 <= puVar17) goto LAB_00107fc7;
  goto LAB_00107fa8;
LAB_001083f1:
  puVar33 = (ulong *)((long)puVar43 + 1);
  uVar28 = (int)puVar33 - iVar24;
  puVar45 = (ulong *)((long)puVar43 + 2);
  if (puVar44 < puVar45) goto LAB_001075aa;
  goto LAB_00107d08;
LAB_00106d7a:
  lVar16 = lVar16 + (ulong)uVar36;
  piVar37 = (int *)source;
  if (uVar36 < uVar41) {
    piVar37 = piVar27;
  }
  iVar24 = uVar28 - uVar36;
  uVar20 = (int)puVar32 - (int)puVar43;
  lVar30 = 0;
  uVar28 = uVar20 - 0xf;
  cVar6 = (char)puVar32 * '\x10' + (char)puVar43 * -0x10;
  do {
    cVar13 = cVar6;
    uVar36 = uVar28;
    lVar31 = lVar30;
    piVar22 = (int *)(lVar16 + lVar31);
    puVar44 = (ulong *)((long)puVar32 + lVar31);
    if ((piVar22 <= piVar37) || (puVar44 <= puVar43)) break;
    lVar30 = lVar31 + -1;
    uVar28 = uVar36 - 1;
    cVar6 = cVar13 + -0x10;
  } while (*(char *)((long)puVar32 + lVar31 + -1) == *(char *)(lVar16 + -1 + lVar31));
  iVar46 = (int)lVar31;
  uVar11 = (ulong)(uint)(((int)puVar32 - (int)puVar43) + iVar46);
  uVar25 = 0;
  if (dest + ((ulong)uVar20 + lVar31 & 0xffffffff) / 0xff + uVar11 + 9 <= pcVar12) {
    puVar32 = (ulong *)(dest + 1);
    if ((uint)((ulong)uVar20 + lVar31) < 0xf) {
      *dest = cVar13;
    }
    else {
      uVar14 = (ulong)(uVar20 - 0xf) + lVar31;
      *dest = -0x10;
      if (0xfe < (int)uVar14) {
        uVar28 = 0x1fd;
        if (uVar36 < 0x1fd) {
          uVar28 = uVar36;
        }
        if (0x1fc < (int)uVar36) {
          uVar36 = 0x1fd;
        }
        memset(puVar32,0xff,(ulong)((((uVar20 + 0xef) - uVar28) + iVar46) / 0xff + 1));
        uVar28 = ((uVar20 + 0xef) - uVar36) + iVar46;
        puVar32 = (ulong *)(dest + (ulong)uVar28 / 0xff + 2);
        uVar14 = (ulong)((uVar20 - 0x10e) + iVar46 + (uVar28 % 0xff - uVar28));
      }
      *(char *)puVar32 = (char)uVar14;
      puVar32 = (ulong *)((long)puVar32 + 1);
    }
    puVar15 = (ulong *)(uVar11 + (long)puVar32);
    do {
      *puVar32 = *puVar43;
      puVar32 = puVar32 + 1;
      puVar43 = puVar43 + 1;
    } while (puVar32 < puVar15);
    do {
      *(short *)puVar15 = (short)iVar24;
      if (piVar37 == piVar27) {
        puVar32 = (ulong *)((lVar39 - (long)piVar22) + (long)puVar44);
        if (puVar33 < puVar32) {
          puVar32 = puVar33;
        }
        puVar43 = (ulong *)((long)puVar44 + 4);
        puVar29 = (ulong *)(piVar22 + 1);
        puVar17 = (ulong *)((long)puVar32 - 7);
        puVar18 = puVar43;
        if (puVar43 < puVar17) {
          if (*puVar29 == *puVar43) {
            puVar29 = (ulong *)(piVar22 + 3);
            puVar18 = (ulong *)((long)puVar44 + 0xc);
            goto LAB_00107022;
          }
          uVar11 = *puVar43 ^ *puVar29;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar28 = (uint)lVar16 >> 3;
        }
        else {
LAB_00107022:
          if (puVar18 < puVar17) {
            iVar24 = ((int)puVar18 - (int)puVar44) + -4;
LAB_00107031:
            if (*puVar29 == *puVar18) goto code_r0x00107040;
            uVar14 = *puVar18 ^ *puVar29;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar28 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar24;
            goto LAB_001070e7;
          }
LAB_00107051:
          if ((puVar18 < (ulong *)((long)puVar32 - 3U)) && ((int)*puVar29 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar18 < (ulong *)((long)puVar32 - 1U)) && ((short)*puVar29 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar18 < puVar32) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar29 == (char)*puVar18));
          }
          uVar28 = (int)puVar18 - (int)puVar43;
        }
LAB_001070e7:
        puVar43 = (ulong *)((long)puVar44 + (ulong)uVar28 + 4);
        if (puVar43 == puVar32) {
          puVar17 = puVar32;
          puVar29 = (ulong *)source;
          if (puVar32 < puVar1) {
            if (*(ulong *)source == *puVar32) {
              puVar17 = puVar32 + 1;
              puVar29 = (ulong *)(source + 8);
              goto LAB_0010711f;
            }
            uVar14 = *puVar32 ^ *(ulong *)source;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = uVar11 >> 3 & 0x1fffffff;
          }
          else {
LAB_0010711f:
            if (puVar17 < puVar1) {
              puVar44 = (ulong *)((long)puVar44 + (lVar39 - (long)piVar22));
              if (puVar33 <= puVar44) {
                puVar44 = puVar33;
              }
              iVar24 = (int)puVar17 - (int)puVar44;
LAB_0010713e:
              if (*puVar29 == *puVar17) goto code_r0x00107149;
              uVar14 = *puVar17 ^ *puVar29;
              uVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = (ulong)(((uint)(uVar11 >> 3) & 0x1fffffff) + iVar24);
              goto LAB_001071c0;
            }
LAB_0010715a:
            if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar29 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar29 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar17 < puVar33) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar29 == (char)*puVar17));
            }
            uVar11 = (ulong)(uint)((int)puVar17 - (int)puVar32);
          }
LAB_001071c0:
          uVar28 = uVar28 + (int)uVar11;
          puVar43 = (ulong *)((long)puVar43 + uVar11);
        }
      }
      else {
        puVar43 = (ulong *)((long)puVar44 + 4);
        puVar32 = (ulong *)(piVar22 + 1);
        puVar17 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar32 == *puVar43) {
            puVar32 = (ulong *)(piVar22 + 3);
            puVar17 = (ulong *)((long)puVar44 + 0xc);
            goto LAB_00106f5f;
          }
          uVar11 = *puVar43 ^ *puVar32;
          lVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar28 = (uint)lVar16 >> 3;
        }
        else {
LAB_00106f5f:
          if (puVar17 < puVar1) {
            iVar24 = ((int)puVar17 - (int)puVar44) + -4;
LAB_00106f6c:
            if (*puVar32 == *puVar17) goto code_r0x00106f7b;
            uVar14 = *puVar17 ^ *puVar32;
            uVar11 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar28 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar24;
            goto LAB_001070bb;
          }
LAB_00106f8b:
          if ((puVar17 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar32 == (int)*puVar17))
          {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar17 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar32 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar17 < puVar33) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar32 == (char)*puVar17));
          }
          uVar28 = (int)puVar17 - (int)puVar43;
        }
LAB_001070bb:
        puVar43 = (ulong *)((long)puVar44 + (ulong)uVar28 + 4);
      }
      uVar25 = 0;
      if (pcVar12 < (char *)((long)puVar15 + (ulong)(uVar28 + 0xf0) / 0xff + 8)) break;
      pcVar10 = (char *)((long)puVar15 + 2);
      if (uVar28 < 0xf) {
        *dest = *dest + (char)uVar28;
        dest = pcVar10;
      }
      else {
        *dest = *dest + '\x0f';
        uVar23 = (ushort)(uVar28 - 0xf);
        pcVar10[0] = -1;
        pcVar10[1] = -1;
        pcVar10[2] = -1;
        pcVar10[3] = -1;
        if (0x3fb < uVar28 - 0xf) {
          uVar23 = (ushort)((ulong)(uVar28 - 0x40b) % 0x3fc);
          uVar11 = (ulong)((uVar28 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar15 + 6),0xff,uVar11 + 4);
          pcVar10 = (char *)((long)puVar15 + uVar11 + 6);
        }
        pcVar10[uVar23 / 0xff] = (char)(uVar23 % 0xff);
        dest = pcVar10 + uVar23 / 0xff + 1;
      }
      if (puVar45 <= puVar43) goto LAB_001097db;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar43 + -2) - iVar21;
      uVar11 = *puVar43 * -0x30e4432345000000 >> 0x34;
      uVar25 = (int)puVar43 - iVar21;
      uVar28 = *(uint *)((long)LZ4_stream + uVar11 * 4);
      piVar37 = (int *)source;
      lVar16 = lVar7;
      if (uVar28 < uVar41) {
        piVar37 = piVar27;
        lVar16 = lVar42;
      }
      *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar25;
      if ((uVar28 + 0xffff < uVar25) ||
         (piVar22 = (int *)(lVar16 + (ulong)uVar28), *piVar22 != (int)*puVar43)) goto LAB_00107344;
      puVar15 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar24 = uVar25 - uVar28;
      puVar44 = puVar43;
    } while( true );
  }
  goto LAB_001098a3;
code_r0x00107040:
  puVar18 = puVar18 + 1;
  puVar29 = puVar29 + 1;
  iVar24 = iVar24 + 8;
  if (puVar17 <= puVar18) goto LAB_00107051;
  goto LAB_00107031;
code_r0x00107149:
  puVar17 = puVar17 + 1;
  puVar29 = puVar29 + 1;
  iVar24 = iVar24 + 8;
  if (puVar1 <= puVar17) goto LAB_0010715a;
  goto LAB_0010713e;
code_r0x00106f7b:
  puVar17 = puVar17 + 1;
  puVar32 = puVar32 + 1;
  iVar24 = iVar24 + 8;
  if (puVar1 <= puVar17) goto LAB_00106f8b;
  goto LAB_00106f6c;
LAB_00107344:
  puVar32 = (ulong *)((long)puVar43 + 1);
  uVar28 = (int)puVar32 - iVar21;
  puVar44 = (ulong *)((long)puVar43 + 2);
  if (puVar45 < puVar44) goto LAB_001097db;
  goto LAB_00106d10;
LAB_001097db:
  pcVar10 = source + ((ulong)(uint)inputSize - (long)puVar43);
  uVar25 = 0;
  if (pcVar12 < dest + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1)) goto LAB_001098a3;
  if (pcVar10 < (char *)0xf) {
    *dest = (char)pcVar10 << 4;
  }
  else {
    pcVar12 = pcVar10 + -0xf;
    *dest = -0x10;
    pcVar35 = dest + 1;
    if ((char *)0xfe < pcVar12) {
      uVar11 = (ulong)(pcVar10 + -0x10e) / 0xff;
      memset(pcVar35,0xff,uVar11 + 1);
      pcVar12 = pcVar10 + uVar11 * -0xff + -0x10e;
      pcVar35 = dest + uVar11 + 2;
    }
    *pcVar35 = (char)pcVar12;
    dest = pcVar35;
  }
  pcVar12 = dest + 1;
  goto LAB_00109890;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}